

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O1

char * ODDLParser::OpenDDLParser::parseName(char *in,char *end,Name **name)

{
  byte bVar1;
  Text *id_00;
  Name *this;
  byte *pbVar2;
  Text *id;
  Text *local_30;
  
  *name = (Name *)0x0;
  pbVar2 = (byte *)in;
  if (in != end && in != (char *)0x0) {
    do {
      in = (char *)pbVar2;
      if ((0x2c < (ulong)*pbVar2) || ((0x100100002600U >> ((ulong)*pbVar2 & 0x3f) & 1) == 0)) break;
      pbVar2 = pbVar2 + 1;
      in = end;
    } while (pbVar2 != (byte *)end);
    bVar1 = *in;
    if ((bVar1 & 0xfe) == 0x24) {
      local_30 = (Text *)0x0;
      in = parseIdentifier((char *)((byte *)in + 1),end,&local_30);
      id_00 = local_30;
      if (local_30 != (Text *)0x0) {
        this = (Name *)operator_new(0x10);
        Name::Name(this,(uint)(bVar1 == 0x25),id_00);
        *name = this;
      }
    }
  }
  return (char *)(byte *)in;
}

Assistant:

char *OpenDDLParser::parseName( char *in, char *end, Name **name ) {
    *name = ddl_nullptr;
    if( ddl_nullptr == in || in == end ) {
        return in;
    }

    // ignore blanks
    in = lookForNextToken( in, end );
    if( *in != '$' && *in != '%' ) {
        return in;
    }

    NameType ntype( GlobalName );
    if( *in == '%' ) {
        ntype = LocalName;
    }
    in++;
    Name *currentName( ddl_nullptr );
    Text *id( ddl_nullptr );
    in = parseIdentifier( in, end, &id );
    if( id ) {
        currentName = new Name( ntype, id );
        if( currentName ) {
            *name = currentName;
        }
    }

    return in;
}